

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall
google::protobuf::UnknownFieldSet::SwapSlow(UnknownFieldSet *this,UnknownFieldSet *other)

{
  int iVar1;
  UnknownFieldSet tmp;
  anon_union_16_2_b9f6da03_for_SooRep_0 local_28;
  
  local_28.long_rep.elements_int = 0;
  local_28.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
  MergeFrom((UnknownFieldSet *)&local_28.long_rep,this);
  iVar1 = internal::SooRep::size
                    ((SooRep *)this,
                     (undefined1  [16])
                     ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  if (iVar1 != 0) {
    ClearFallback(this);
  }
  MergeFrom(this,other);
  iVar1 = internal::SooRep::size
                    ((SooRep *)other,
                     (undefined1  [16])
                     ((undefined1  [16])(other->fields_).soo_rep_.field_0 & (undefined1  [16])0x4)
                     == (undefined1  [16])0x0);
  if (iVar1 != 0) {
    ClearFallback(other);
  }
  MergeFrom(other,(UnknownFieldSet *)&local_28.long_rep);
  iVar1 = internal::SooRep::size
                    ((SooRep *)&local_28.long_rep,(local_28.long_rep.elements_int & 4) == 0);
  if (iVar1 != 0) {
    ClearFallback((UnknownFieldSet *)&local_28.long_rep);
  }
  RepeatedField<google::protobuf::UnknownField>::~RepeatedField
            ((RepeatedField<google::protobuf::UnknownField> *)&local_28.long_rep);
  return;
}

Assistant:

void UnknownFieldSet::SwapSlow(UnknownFieldSet* other) {
  UnknownFieldSet tmp;
  tmp.MergeFrom(*this);
  this->Clear();
  this->MergeFrom(*other);
  other->Clear();
  other->MergeFrom(tmp);
}